

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O1

void __thiscall cppcms::application_specific_pool::_pool_policy::~_pool_policy(_pool_policy *this)

{
  application *paVar1;
  pointer ppaVar2;
  ulong uVar3;
  
  (this->super__policy)._vptr__policy = (_func_int **)&PTR_prepopulate_00288a98;
  if (this->size_ != 0) {
    uVar3 = 0;
    do {
      paVar1 = (this->apps_).
               super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar3];
      if (paVar1 != (application *)0x0) {
        (*paVar1->_vptr_application[1])();
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->size_);
  }
  ppaVar2 = (this->apps_).
            super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppaVar2 != (pointer)0x0) {
    operator_delete(ppaVar2);
    return;
  }
  return;
}

Assistant:

~_pool_policy()
	{
		for(size_t i=0;i<size_;i++)
			delete apps_[i];
	}